

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O3

void __thiscall
flatbuffers::BinaryAnnotator::BuildTable
          (BinaryAnnotator *this,uint64_t table_offset,BinarySectionType type,Object *table)

{
  Object *pOVar1;
  uint *puVar2;
  uint8_t value;
  ushort uVar3;
  uint uVar4;
  Field *field;
  uint64_t uVar5;
  long lVar6;
  __normal_iterator<flatbuffers::BinaryAnnotator::VTable::Entry_*,_std::vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
  _Var7;
  iterator iVar8;
  char cVar9;
  bool bVar10;
  VTable *pVVar11;
  _Rb_tree_header *p_Var12;
  _Base_ptr p_Var13;
  long lVar14;
  long *plVar15;
  ulong uVar16;
  long *plVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  undefined2 uVar19;
  Schema *pSVar20;
  ulong uVar21;
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
  *this_00;
  uint64_t uVar22;
  char cVar23;
  Field *pFVar24;
  undefined8 uVar25;
  BinaryRegionType type_00;
  _Alloc_hider _Var26;
  ulong uVar27;
  ulong uVar28;
  Object *pOVar29;
  ulong offset;
  _Base_ptr p_Var30;
  string offset_prefix;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  string enum_type;
  vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
  fields;
  BinaryRegionType local_d34;
  undefined1 local_d28 [8];
  _Alloc_hider local_d20;
  undefined1 local_d18 [24];
  undefined1 local_d00 [8];
  _Alloc_hider local_cf8;
  pointer local_cf0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ce8;
  _Alloc_hider local_cd8;
  char *local_cd0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_cc8;
  size_t local_cb8;
  string local_cb0;
  uint64_t local_c90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c88;
  uint64_t local_c80;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_c78;
  Object *local_c58;
  allocator<char> local_c49;
  string local_c48;
  __normal_iterator<flatbuffers::BinaryAnnotator::VTable::Entry_*,_std::vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
  local_c28;
  iterator iStack_c20;
  Entry *local_c18;
  undefined1 local_c10 [32];
  undefined8 uStack_bf0;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_be8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_bd0;
  _Alloc_hider local_bb8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ba8;
  _Alloc_hider local_b98;
  ios_base local_b90 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b88 [6];
  char acStack_b20 [152];
  _Base_ptr local_a88;
  ulong local_a80;
  BinarySectionType local_a74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a70;
  map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
  *local_a50;
  VTable *local_a48;
  BinaryRegionStatus local_a40;
  undefined1 *local_a38;
  long local_a30;
  undefined1 local_a28;
  undefined7 uStack_a27;
  BinaryRegionCommentType local_a18;
  undefined1 *local_a10;
  long local_a08;
  undefined1 local_a00;
  undefined7 uStack_9ff;
  undefined1 *local_9f0;
  long local_9e8;
  undefined1 local_9e0;
  undefined7 uStack_9df;
  size_t local_9d0;
  long *local_9c8;
  uint local_9c0;
  long local_9b8 [2];
  long *local_9a8;
  uint local_9a0;
  long local_998 [2];
  long *local_988 [2];
  long local_978 [2];
  long *local_968 [2];
  long local_958 [2];
  undefined1 local_948 [8];
  _Alloc_hider local_940;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_930;
  BinaryRegionCommentType local_920;
  _Alloc_hider local_918;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_908;
  _Alloc_hider local_8f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8e8;
  size_t local_8d8;
  undefined1 local_8d0 [8];
  _Alloc_hider local_8c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8b8;
  BinaryRegionCommentType local_8a8;
  _Alloc_hider local_8a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_890;
  _Alloc_hider local_880;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_870;
  size_t local_860;
  undefined1 local_858 [8];
  _Alloc_hider local_850;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_840;
  BinaryRegionCommentType local_830;
  _Alloc_hider local_828;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_818;
  _Alloc_hider local_808;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7f8;
  size_t local_7e8;
  undefined1 local_7e0 [8];
  _Alloc_hider local_7d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7c8;
  BinaryRegionCommentType local_7b8;
  _Alloc_hider local_7b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7a0;
  _Alloc_hider local_790;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_780;
  size_t local_770;
  undefined1 local_768 [8];
  _Alloc_hider local_760;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_750;
  BinaryRegionCommentType local_740;
  _Alloc_hider local_738;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_728;
  _Alloc_hider local_718;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_708;
  size_t local_6f8;
  undefined1 local_6f0 [8];
  _Alloc_hider local_6e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6d8;
  BinaryRegionCommentType local_6c8;
  _Alloc_hider local_6c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6b0;
  _Alloc_hider local_6a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_690;
  size_t local_680;
  undefined1 local_678 [8];
  _Alloc_hider local_670;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_660;
  BinaryRegionCommentType local_650;
  _Alloc_hider local_648;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_638;
  _Alloc_hider local_628;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_618;
  size_t local_608;
  undefined1 local_600 [8];
  _Alloc_hider local_5f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e8;
  BinaryRegionCommentType local_5d8;
  _Alloc_hider local_5d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5c0;
  _Alloc_hider local_5b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a0;
  size_t local_590;
  undefined1 local_588 [8];
  _Alloc_hider local_580;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_570;
  BinaryRegionCommentType local_560;
  _Alloc_hider local_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_548;
  _Alloc_hider local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_528;
  size_t local_518;
  undefined1 local_510 [8];
  _Alloc_hider local_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  BinaryRegionCommentType local_4e8;
  _Alloc_hider local_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  _Alloc_hider local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0;
  size_t local_4a0;
  string local_498;
  long *local_478 [2];
  long local_468 [2];
  long *local_458 [2];
  long local_448 [2];
  long *local_438 [2];
  long local_428 [2];
  long *local_418 [2];
  long local_408 [2];
  undefined1 local_3f8 [8];
  _Alloc_hider local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0;
  BinaryRegionCommentType local_3d0;
  _Alloc_hider local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  _Alloc_hider local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  size_t local_388;
  undefined1 local_380 [8];
  _Alloc_hider local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  BinaryRegionCommentType local_358;
  _Alloc_hider local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  _Alloc_hider local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  size_t local_310;
  undefined1 local_308 [8];
  _Alloc_hider local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  BinaryRegionCommentType local_2e0;
  _Alloc_hider local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  _Alloc_hider local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  size_t local_298;
  undefined1 local_290 [8];
  _Alloc_hider local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  BinaryRegionCommentType local_268;
  _Alloc_hider local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  _Alloc_hider local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  size_t local_220;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_218;
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
  local_1f8;
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
  local_1c8;
  BinaryRegionComment local_198;
  BinaryRegionComment local_120;
  BinaryRegionComment local_a8;
  
  bVar10 = ContainsSection(this,table_offset);
  if (bVar10) {
    return;
  }
  local_a40 = OK;
  local_a38 = &local_a28;
  local_a30 = 0;
  local_a28 = 0;
  local_a10 = &local_a00;
  local_a08 = 0;
  local_a00 = 0;
  local_9f0 = &local_9e0;
  local_9e8 = 0;
  local_9e0 = 0;
  local_9d0 = 0;
  local_a18 = TableVTableOffset;
  uVar27 = this->binary_length_;
  local_c58 = table;
  if (uVar27 < 5 || uVar27 <= table_offset + 3) {
    uVar22 = 0;
    if (table_offset <= uVar27) {
      uVar22 = uVar27 - table_offset;
    }
    local_418[0] = local_408;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"4","");
    local_a40 = ERROR_INCOMPLETE_BINARY;
    std::__cxx11::string::_M_assign((string *)&local_a38);
    if (local_418[0] != local_408) {
      operator_delete(local_418[0],local_408[0] + 1);
    }
    pOVar29 = local_c58 + *(ushort *)(local_c58 + (4 - (long)*(int *)local_c58));
    local_cb0._M_dataplus._M_p = (pointer)&local_cb0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_cb0,
               pOVar29 + (ulong)*(uint *)(local_c58 +
                                         *(ushort *)(local_c58 + (4 - (long)*(int *)local_c58))) + 4
               ,pOVar29 + (ulong)*(uint *)(pOVar29 + (ulong)*(uint *)(local_c58 +
                                                                     *(ushort *)
                                                                      (local_c58 +
                                                                      (4 - (long)*(int *)local_c58))
                                                                     ) + 4 + -4) +
                          (ulong)*(uint *)(local_c58 +
                                          *(ushort *)(local_c58 + (4 - (long)*(int *)local_c58))) +
                          4);
    local_308._0_4_ = local_a40;
    local_300._M_p = (pointer)&local_2f0;
    std::__cxx11::string::_M_construct<char*>((string *)&local_300,local_a38,local_a38 + local_a30);
    local_2e0 = local_a18;
    local_2d8._M_p = (pointer)&local_2c8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_2d8,local_a10,local_a10 + local_a08);
    local_2b8._M_p = (pointer)&local_2a8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_2b8,local_9f0,local_9f0 + local_9e8);
    local_298 = local_9d0;
    anon_unknown_49::MakeBinaryRegion
              ((BinaryRegion *)local_c10,table_offset,uVar22,Unknown,uVar22,0,
               (BinaryRegionComment *)local_308);
    anon_unknown_49::MakeSingleRegionBinarySection
              ((BinarySection *)local_d28,&local_cb0,type,(BinaryRegion *)local_c10);
    AddSection(this,table_offset,(BinarySection *)local_d28);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
              ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
               local_d00);
    if (local_d28 != (undefined1  [8])local_d18) {
      operator_delete((void *)local_d28,local_d18._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b98._M_p != local_b88) {
      operator_delete(local_b98._M_p,local_b88[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bb8._M_p != &local_ba8) {
      operator_delete(local_bb8._M_p,local_ba8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_be8.
           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
           ._M_impl.super__Vector_impl_data._M_finish != &local_bd0) {
      operator_delete(local_be8.
                      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                      ._M_impl.super__Vector_impl_data._M_finish,local_bd0._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_p != &local_2a8) {
      operator_delete(local_2b8._M_p,local_2a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_p != &local_2c8) {
      operator_delete(local_2d8._M_p,local_2c8._M_allocated_capacity + 1);
    }
    _Var26._M_p = local_300._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_p != &local_2f0) {
LAB_003041bb:
      operator_delete(_Var26._M_p,local_2f0._M_allocated_capacity + 1);
    }
  }
  else {
    uVar21 = table_offset - (long)*(int *)(this->binary_ + table_offset);
    if (uVar21 < uVar27) {
      local_c78.
      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c78.
      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c78.
      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_290._0_4_ = OK;
      local_c80 = table_offset;
      local_288._M_p = (pointer)&local_278;
      std::__cxx11::string::_M_construct<char*>((string *)&local_288,local_a38,local_a38);
      local_268 = local_a18;
      local_260._M_p = (pointer)&local_250;
      local_a74 = type;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_260,local_a10,local_a10 + local_a08);
      local_240._M_p = (pointer)&local_230;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_240,local_9f0,local_9f0 + local_9e8);
      local_220 = local_9d0;
      anon_unknown_49::MakeBinaryRegion
                ((BinaryRegion *)local_c10,local_c80,4,SOffset,0,uVar21,
                 (BinaryRegionComment *)local_290);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
      emplace_back<flatbuffers::BinaryRegion>(&local_c78,(BinaryRegion *)local_c10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b98._M_p != local_b88) {
        operator_delete(local_b98._M_p,local_b88[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bb8._M_p != &local_ba8) {
        operator_delete(local_bb8._M_p,local_ba8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_be8.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_finish != &local_bd0) {
        operator_delete(local_be8.
                        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                        local_bd0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_p != &local_230) {
        operator_delete(local_240._M_p,local_230._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_p != &local_250) {
        operator_delete(local_260._M_p,local_250._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_p != &local_278) {
        operator_delete(local_288._M_p,local_278._M_allocated_capacity + 1);
      }
      uVar22 = local_c80;
      pVVar11 = GetOrBuildVTable(this,uVar21,local_c58,local_c80);
      if (pVVar11 != (VTable *)0x0) {
        local_a80 = pVVar11->table_size + uVar22;
        if (this->binary_length_ <= (pVVar11->table_size + uVar22) - 1) {
          local_a80 = this->binary_length_;
        }
        local_c28._M_current = (Entry *)0x0;
        iStack_c20._M_current = (Entry *)0x0;
        local_c18 = (Entry *)0x0;
        p_Var13 = (pVVar11->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var12 = &(pVVar11->fields)._M_t._M_impl.super__Rb_tree_header;
        local_a88 = &p_Var12->_M_header;
        local_a48 = pVVar11;
        if ((_Rb_tree_header *)p_Var13 != p_Var12) {
          local_a50 = &pVVar11->fields;
          do {
            if (iStack_c20._M_current == local_c18) {
              std::
              vector<flatbuffers::BinaryAnnotator::VTable::Entry,std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>>
              ::_M_realloc_insert<flatbuffers::BinaryAnnotator::VTable::Entry_const&>
                        ((vector<flatbuffers::BinaryAnnotator::VTable::Entry,std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>>
                          *)&local_c28,iStack_c20,(Entry *)&p_Var13[1]._M_parent);
            }
            else {
              p_Var30 = p_Var13[1]._M_left;
              (iStack_c20._M_current)->field = (Field *)p_Var13[1]._M_parent;
              *(_Base_ptr *)&(iStack_c20._M_current)->offset_from_table = p_Var30;
              iStack_c20._M_current = iStack_c20._M_current + 1;
            }
            p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
            iVar8._M_current = iStack_c20._M_current;
            _Var7._M_current = local_c28._M_current;
          } while ((_Rb_tree_header *)p_Var13 != p_Var12);
          if (local_c28._M_current != iStack_c20._M_current) {
            lVar14 = (long)iStack_c20._M_current - (long)local_c28._M_current >> 4;
            std::
            _Temporary_buffer<__gnu_cxx::__normal_iterator<flatbuffers::BinaryAnnotator::VTable::Entry_*,_std::vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>_>,_flatbuffers::BinaryAnnotator::VTable::Entry>
            ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<flatbuffers::BinaryAnnotator::VTable::Entry_*,_std::vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>_>,_flatbuffers::BinaryAnnotator::VTable::Entry>
                                 *)local_c10,local_c28,(lVar14 - (lVar14 + 1 >> 0x3f)) + 1 >> 1);
            if ((pointer)local_c10._16_8_ == (pointer)0x0) {
              std::
              __inplace_stable_sort<__gnu_cxx::__normal_iterator<flatbuffers::BinaryAnnotator::VTable::Entry*,std::vector<flatbuffers::BinaryAnnotator::VTable::Entry,std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>>>,__gnu_cxx::__ops::_Iter_comp_iter<flatbuffers::BinaryAnnotator::BuildTable(unsigned_long,flatbuffers::BinarySectionType,reflection::Object_const*)::__0>>
                        (_Var7._M_current,iVar8._M_current);
            }
            else {
              std::
              __stable_sort_adaptive<__gnu_cxx::__normal_iterator<flatbuffers::BinaryAnnotator::VTable::Entry*,std::vector<flatbuffers::BinaryAnnotator::VTable::Entry,std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>>>,flatbuffers::BinaryAnnotator::VTable::Entry*,long,__gnu_cxx::__ops::_Iter_comp_iter<flatbuffers::BinaryAnnotator::BuildTable(unsigned_long,flatbuffers::BinarySectionType,reflection::Object_const*)::__0>>
                        (_Var7._M_current,iVar8._M_current,local_c10._16_8_,local_c10._8_8_);
            }
            operator_delete((void *)local_c10._16_8_,local_c10._8_8_ << 4);
          }
          if ((long)iStack_c20._M_current - (long)local_c28._M_current != 0) {
            uVar27 = (long)iStack_c20._M_current - (long)local_c28._M_current >> 4;
            local_c88 = local_b88;
            uVar21 = 0;
            do {
              if ((ulong)local_c28._M_current[uVar21].offset_from_table == 0) goto LAB_0030664e;
              offset = local_c28._M_current[uVar21].offset_from_table + local_c80;
              uVar28 = this->binary_length_;
              if (uVar28 <= offset) goto LAB_0030664e;
              field = local_c28._M_current[uVar21].field;
              if (field == (Field *)0x0) {
                uVar16 = local_a80;
                if (uVar21 + 1 < uVar27) {
                  uVar16 = local_c28._M_current[uVar21 + 1].offset_from_table + local_c80;
                }
                uVar27 = uVar16 - offset;
                if (uVar27 == 0) goto LAB_0030664e;
                local_cb0._M_dataplus._M_p = (pointer)&local_cb0.field_2;
                local_cb0._M_string_length = 0;
                local_cb0.field_2._M_allocated_capacity =
                     local_cb0.field_2._M_allocated_capacity & 0xffffffffffffff00;
                if (uVar27 == 4) {
                  if ((4 < uVar28) && (offset + 3 < uVar28)) {
                    std::__cxx11::string::append((char *)&local_cb0);
                    std::__cxx11::stringstream::stringstream((stringstream *)local_c10);
                    *(uint *)((long)&local_be8.
                                     super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                             *(long *)(local_c10._16_8_ - 0x18)) =
                         *(uint *)((long)&local_be8.
                                          super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  *(long *)(local_c10._16_8_ - 0x18)) & 0xffffffb5 | 8;
                    puVar2 = (uint *)((long)&local_be8.
                                             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                             ._M_impl.super__Vector_impl_data._M_start +
                                     *(long *)(local_c10._16_8_ - 0x18));
                    *puVar2 = *puVar2 | 0x4000;
                    lVar14 = *(long *)(local_c10._16_8_ - 0x18);
                    if (acStack_b20[lVar14 + 1] == '\0') {
                      std::ios::widen((char)lVar14);
                      acStack_b20[lVar14 + 1] = '\x01';
                    }
                    acStack_b20[lVar14] = '0';
                    *(undefined8 *)((long)&uStack_bf0 + *(long *)(local_c10._16_8_ - 0x18)) = 8;
                    std::ostream::_M_insert<unsigned_long>((ulong)(local_c10 + 0x10));
                    std::__cxx11::stringbuf::str();
                    std::__cxx11::stringstream::~stringstream((stringstream *)local_c10);
                    std::ios_base::~ios_base(local_b90);
                    std::__cxx11::string::_M_append((char *)&local_cb0,(ulong)local_d28);
                    if (local_d28 != (undefined1  [8])local_d18) {
                      operator_delete((void *)local_d28,local_d18._0_8_ + 1);
                    }
                    std::__cxx11::string::append((char *)&local_cb0);
                    uVar28 = this->binary_length_;
                  }
                  local_d28 = (undefined1  [8])((ulong)local_d28 & 0xffffffff00000000);
                  if ((4 < uVar28) && (offset + 3 < uVar28)) goto LAB_00304d11;
                  uVar22 = 0;
                  if (offset <= uVar28) {
                    uVar22 = uVar28 - offset;
                  }
                  cVar23 = '\x01';
LAB_003063a1:
                  local_cd8._M_p = (pointer)&local_cc8;
                  local_cf8._M_p = (pointer)&local_ce8;
                  local_d20._M_p = local_d18 + 8;
                  local_cb8 = 0;
                  local_cc8._M_local_buf[0] = '\0';
                  local_cd0 = (char *)0x0;
                  local_ce8._M_local_buf[0] = '\0';
                  local_cf0 = (pointer)0x0;
                  local_d00._0_4_ = TableUnknownField;
                  local_d18[8] = '\0';
                  local_d18._0_8_ = 0;
                  local_9a8 = local_998;
                  std::__cxx11::string::_M_construct((ulong)&local_9a8,cVar23);
                  std::__detail::__to_chars_10_impl<unsigned_long>
                            ((char *)local_9a8,local_9a0,uVar27);
                  local_d28._0_4_ = 0xca;
                  std::__cxx11::string::_M_assign((string *)&local_d20);
                  if (local_9a8 != local_998) {
                    operator_delete(local_9a8,local_998[0] + 1);
                  }
                  local_510._0_4_ = local_d28._0_4_;
                  local_508._M_p = (pointer)&local_4f8;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_508,local_d20._M_p,local_d20._M_p + local_d18._0_8_);
                  local_4e8 = local_d00._0_4_;
                  local_4e0._M_p = (pointer)&local_4d0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_4e0,local_cf8._M_p,
                             local_cf8._M_p + (long)&local_cf0->offset);
                  local_4c0._M_p = (pointer)&local_4b0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_4c0,local_cd8._M_p,local_cd0 + (long)local_cd8._M_p);
                  local_4a0 = local_cb8;
                  anon_unknown_49::MakeBinaryRegion
                            ((BinaryRegion *)local_c10,offset,uVar22,Unknown,uVar22,0,
                             (BinaryRegionComment *)local_510);
                  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                  ::emplace_back<flatbuffers::BinaryRegion>(&local_c78,(BinaryRegion *)local_c10);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b98._M_p != local_c88) {
                    operator_delete(local_b98._M_p,local_b88[0]._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_bb8._M_p != &local_ba8) {
                    operator_delete(local_bb8._M_p,local_ba8._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_be8.
                         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                         ._M_impl.super__Vector_impl_data._M_finish != &local_bd0) {
                    operator_delete(local_be8.
                                    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,
                                    local_bd0._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4c0._M_p != &local_4b0) {
                    operator_delete(local_4c0._M_p,local_4b0._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4e0._M_p != &local_4d0) {
                    operator_delete(local_4e0._M_p,local_4d0._M_allocated_capacity + 1);
                  }
                  uVar25 = local_4f8._M_allocated_capacity;
                  _Var26._M_p = local_508._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_508._M_p != &local_4f8) goto LAB_003065c7;
                }
                else {
                  local_d28 = (undefined1  [8])((ulong)(uint)local_d28._4_4_ << 0x20);
                  if (uVar28 <= uVar27 || uVar28 <= uVar16 - 1) {
                    uVar22 = 0;
                    if (offset <= uVar28) {
                      uVar22 = uVar28 - offset;
                    }
                    cVar23 = '\x01';
                    if (9 < uVar27) {
                      uVar28 = uVar27;
                      cVar9 = '\x04';
                      do {
                        cVar23 = cVar9;
                        if (uVar28 < 100) {
                          cVar23 = cVar23 + -2;
                          goto LAB_003063a1;
                        }
                        if (uVar28 < 1000) {
                          cVar23 = cVar23 + -1;
                          goto LAB_003063a1;
                        }
                        if (uVar28 < 10000) goto LAB_003063a1;
                        bVar10 = 99999 < uVar28;
                        uVar28 = uVar28 / 10000;
                        cVar9 = cVar23 + '\x04';
                      } while (bVar10);
                      cVar23 = cVar23 + '\x01';
                    }
                    goto LAB_003063a1;
                  }
LAB_00304d11:
                  local_cd8._M_p = (pointer)&local_cc8;
                  local_cf8._M_p = (pointer)&local_ce8;
                  local_d20._M_p = local_d18 + 8;
                  local_cb8 = 0;
                  local_cc8._M_local_buf[0] = '\0';
                  local_cd0 = (char *)0x0;
                  local_ce8._M_local_buf[0] = '\0';
                  local_cf0 = (pointer)0x0;
                  local_d00._0_4_ = TableUnknownField;
                  local_d18[8] = '\0';
                  local_d18._0_8_ = 0;
                  std::__cxx11::string::_M_assign((string *)&local_cd8);
                  local_588._0_4_ = local_d28._0_4_;
                  local_580._M_p = (pointer)&local_570;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_580,local_d20._M_p,local_d20._M_p + local_d18._0_8_);
                  local_560 = local_d00._0_4_;
                  local_558._M_p = (pointer)&local_548;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_558,local_cf8._M_p,
                             local_cf8._M_p + (long)&local_cf0->offset);
                  local_538._M_p = (pointer)&local_528;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_538,local_cd8._M_p,local_cd0 + (long)local_cd8._M_p);
                  local_518 = local_cb8;
                  anon_unknown_49::MakeBinaryRegion
                            ((BinaryRegion *)local_c10,offset,uVar27,Unknown,uVar27,0,
                             (BinaryRegionComment *)local_588);
                  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                  ::emplace_back<flatbuffers::BinaryRegion>(&local_c78,(BinaryRegion *)local_c10);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b98._M_p != local_c88) {
                    operator_delete(local_b98._M_p,local_b88[0]._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_bb8._M_p != &local_ba8) {
                    operator_delete(local_bb8._M_p,local_ba8._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_be8.
                         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                         ._M_impl.super__Vector_impl_data._M_finish != &local_bd0) {
                    operator_delete(local_be8.
                                    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,
                                    local_bd0._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_538._M_p != &local_528) {
                    operator_delete(local_538._M_p,local_528._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_558._M_p != &local_548) {
                    operator_delete(local_558._M_p,local_548._M_allocated_capacity + 1);
                  }
                  uVar25 = local_570._M_allocated_capacity;
                  _Var26._M_p = local_580._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_580._M_p != &local_570) {
LAB_003065c7:
                    operator_delete(_Var26._M_p,uVar25 + 1);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_cd8._M_p != &local_cc8) {
                  operator_delete(local_cd8._M_p,
                                  CONCAT71(local_cc8._M_allocated_capacity._1_7_,
                                           local_cc8._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_cf8._M_p != &local_ce8) {
                  operator_delete(local_cf8._M_p,
                                  CONCAT71(local_ce8._M_allocated_capacity._1_7_,
                                           local_ce8._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d20._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_d18 + 8)) {
                  operator_delete(local_d20._M_p,CONCAT71(local_d18._9_7_,local_d18[8]) + 1);
                }
                uVar25 = local_cb0.field_2._M_allocated_capacity;
                _Var26._M_p = local_cb0._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_cb0._M_dataplus._M_p == &local_cb0.field_2) goto LAB_0030664e;
                goto LAB_00306646;
              }
              lVar14 = -(long)*(int *)field;
              uVar3 = *(ushort *)(field + -(long)*(int *)field);
              if (uVar3 < 7) {
                pFVar24 = (Field *)0x0;
              }
              else {
                uVar27 = (ulong)*(ushort *)(field + lVar14 + 6);
                if (uVar27 == 0) {
                  pFVar24 = (Field *)0x0;
                }
                else {
                  pFVar24 = field + *(uint *)(field + uVar27) + uVar27;
                }
              }
              if (((4 < *(ushort *)(pFVar24 + -(long)*(int *)pFVar24)) &&
                  ((ulong)*(ushort *)(pFVar24 + (4 - (long)*(int *)pFVar24)) != 0)) &&
                 ((int)(char)pFVar24[*(ushort *)(pFVar24 + (4 - (long)*(int *)pFVar24))].super_Table
                  - 1U < 0xc)) {
                if ((uVar3 < 7) || (uVar27 = (ulong)*(ushort *)(field + lVar14 + 6), uVar27 == 0)) {
                  pFVar24 = (Field *)0x0;
                }
                else {
                  pFVar24 = field + *(uint *)(field + uVar27) + uVar27;
                }
                if ((*(ushort *)(pFVar24 + -(long)*(int *)pFVar24) < 5) ||
                   ((ulong)*(ushort *)(pFVar24 + (4 - (long)*(int *)pFVar24)) == 0)) {
                  uVar27 = 0;
                }
                else {
                  uVar27 = (ulong)(uint)(int)(char)pFVar24[*(ushort *)
                                                            (pFVar24 + (4 - (long)*(int *)pFVar24))]
                                                   .super_Table;
                }
                if ((uVar3 < 7) || (uVar28 = (ulong)*(ushort *)(field + lVar14 + 6), uVar28 == 0)) {
                  pFVar24 = (Field *)0x0;
                }
                else {
                  pFVar24 = field + *(uint *)(field + uVar28) + uVar28;
                }
                type_00 = Unknown;
                if (((4 < *(ushort *)(pFVar24 + -(long)*(int *)pFVar24)) &&
                    (type_00 = Unknown,
                    (ulong)*(ushort *)(pFVar24 + (4 - (long)*(int *)pFVar24)) != 0)) &&
                   ((byte)((char)pFVar24[*(ushort *)(pFVar24 + (4 - (long)*(int *)pFVar24))].
                                 super_Table - 1U) < 0xc)) {
                  type_00 = *(BinaryRegionType *)
                             (&DAT_0037f66c +
                             (ulong)(byte)((char)pFVar24[*(ushort *)
                                                          (pFVar24 + (4 - (long)*(int *)pFVar24))].
                                                 super_Table - 1U) * 4);
                }
                uVar27 = (&GetTypeSize(reflection::BaseType)::sizes)[uVar27];
                local_d28 = (undefined1  [8])((ulong)(uint)local_d28._4_4_ << 0x20);
                local_d20._M_p = local_d18 + 8;
                local_d18._0_8_ = 0;
                local_d18[8] = '\0';
                local_cf8._M_p = (pointer)&local_ce8;
                local_cf0 = (pointer)0x0;
                local_ce8._M_local_buf[0] = '\0';
                local_cd8._M_p = (pointer)&local_cc8;
                local_cd0 = (char *)0x0;
                local_cc8._M_local_buf[0] = '\0';
                local_cb8 = 0;
                local_d00._0_4_ = TableField;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_a70,
                           (char *)(field + (ulong)*(uint *)(field + *(ushort *)
                                                                      (field + (4 - (long)*(int *)
                                                  field))) +
                                            (ulong)*(ushort *)(field + (4 - (long)*(int *)field)) +
                                            4),&local_c49);
                plVar15 = (long *)std::__cxx11::string::append((char *)&local_a70);
                local_c48._M_dataplus._M_p = (pointer)&local_c48.field_2;
                paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(plVar15 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar15 == paVar18) {
                  local_c48.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
                  local_c48.field_2._8_8_ = plVar15[3];
                }
                else {
                  local_c48.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
                  local_c48._M_dataplus._M_p = (pointer)*plVar15;
                }
                local_c48._M_string_length = plVar15[1];
                *plVar15 = (long)paVar18;
                plVar15[1] = 0;
                *(undefined1 *)(plVar15 + 2) = 0;
                plVar15 = (long *)std::__cxx11::string::append((char *)&local_c48);
                local_cb0._M_dataplus._M_p = (pointer)&local_cb0.field_2;
                paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(plVar15 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar15 == paVar18) {
                  local_cb0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
                  local_cb0.field_2._8_8_ = plVar15[3];
                }
                else {
                  local_cb0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
                  local_cb0._M_dataplus._M_p = (pointer)*plVar15;
                }
                local_cb0._M_string_length = plVar15[1];
                *plVar15 = (long)paVar18;
                plVar15[1] = 0;
                *(undefined1 *)(plVar15 + 2) = 0;
                plVar15 = (long *)std::__cxx11::string::append((char *)&local_cb0);
                plVar17 = plVar15 + 2;
                if ((long *)*plVar15 == plVar17) {
                  local_c10._16_8_ = *plVar17;
                  local_c10._24_8_ = plVar15[3];
                  local_c10._0_8_ = local_c10 + 0x10;
                }
                else {
                  local_c10._16_8_ = *plVar17;
                  local_c10._0_8_ = (long *)*plVar15;
                }
                local_c10._8_8_ = plVar15[1];
                *plVar15 = (long)plVar17;
                plVar15[1] = 0;
                *(undefined1 *)(plVar15 + 2) = 0;
                std::__cxx11::string::operator=((string *)&local_cf8,(string *)local_c10);
                if ((undefined1 *)local_c10._0_8_ != local_c10 + 0x10) {
                  operator_delete((void *)local_c10._0_8_,(ulong)(local_c10._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_cb0._M_dataplus._M_p != &local_cb0.field_2) {
                  operator_delete(local_cb0._M_dataplus._M_p,
                                  local_cb0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c48._M_dataplus._M_p != &local_c48.field_2) {
                  operator_delete(local_c48._M_dataplus._M_p,
                                  local_c48.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
                  operator_delete(local_a70._M_dataplus._M_p,
                                  local_a70.field_2._M_allocated_capacity + 1);
                }
                uVar28 = this->binary_length_;
                if ((uVar28 <= uVar27) || (uVar28 <= (uVar27 - 1) + offset)) {
                  uVar22 = 0;
                  if (offset <= uVar28) {
                    uVar22 = uVar28 - offset;
                  }
                  cVar23 = '\x01';
                  if (9 < uVar27) {
                    uVar28 = uVar27;
                    cVar9 = '\x04';
                    do {
                      cVar23 = cVar9;
                      if (uVar28 < 100) {
                        cVar23 = cVar23 + -2;
                        goto LAB_0030616b;
                      }
                      if (uVar28 < 1000) {
                        cVar23 = cVar23 + -1;
                        goto LAB_0030616b;
                      }
                      if (uVar28 < 10000) goto LAB_0030616b;
                      bVar10 = 99999 < uVar28;
                      uVar28 = uVar28 / 10000;
                      cVar9 = cVar23 + '\x04';
                    } while (bVar10);
                    cVar23 = cVar23 + '\x01';
                  }
LAB_0030616b:
                  local_9c8 = local_9b8;
                  std::__cxx11::string::_M_construct((ulong)&local_9c8,cVar23);
                  std::__detail::__to_chars_10_impl<unsigned_long>
                            ((char *)local_9c8,local_9c0,uVar27);
                  local_d28._0_4_ = 0xca;
                  std::__cxx11::string::_M_assign((string *)&local_d20);
                  if (local_9c8 != local_9b8) {
                    operator_delete(local_9c8,local_9b8[0] + 1);
                  }
                  local_600._0_4_ = local_d28._0_4_;
                  local_5f8._M_p = (pointer)&local_5e8;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_5f8,local_d20._M_p,local_d20._M_p + local_d18._0_8_);
                  local_5d8 = local_d00._0_4_;
                  local_5d0._M_p = (pointer)&local_5c0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_5d0,local_cf8._M_p,
                             local_cf8._M_p + (long)&local_cf0->offset);
                  local_5b0._M_p = (pointer)&local_5a0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_5b0,local_cd8._M_p,local_cd0 + (long)local_cd8._M_p);
                  local_590 = local_cb8;
                  anon_unknown_49::MakeBinaryRegion
                            ((BinaryRegion *)local_c10,offset,uVar22,Unknown,uVar22,0,
                             (BinaryRegionComment *)local_600);
                  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                  ::emplace_back<flatbuffers::BinaryRegion>(&local_c78,(BinaryRegion *)local_c10);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b98._M_p != local_c88) {
                    operator_delete(local_b98._M_p,local_b88[0]._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_bb8._M_p != &local_ba8) {
                    operator_delete(local_bb8._M_p,local_ba8._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_be8.
                         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                         ._M_impl.super__Vector_impl_data._M_finish != &local_bd0) {
                    operator_delete(local_be8.
                                    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,
                                    local_bd0._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_5b0._M_p != &local_5a0) {
                    operator_delete(local_5b0._M_p,local_5a0._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_5d0._M_p != &local_5c0) {
                    operator_delete(local_5d0._M_p,local_5c0._M_allocated_capacity + 1);
                  }
                  uVar25 = local_5e8._M_allocated_capacity;
                  _Var26._M_p = local_5f8._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_5f8._M_p == &local_5e8) goto LAB_00305ef1;
                  goto LAB_00305ee9;
                }
                bVar10 = IsUnionType(this,field);
                if (bVar10) {
                  if ((this->binary_length_ < 2) || (this->binary_length_ <= offset)) {
                    std::__throw_bad_optional_access();
                  }
                  bVar10 = IsValidUnionValue(this,field,this->binary_[offset]);
                  if (!bVar10) {
                    local_458[0] = local_448;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"");
                    local_d28._0_4_ = 0xce;
                    std::__cxx11::string::_M_assign((string *)&local_d20);
                    if (local_458[0] != local_448) {
                      operator_delete(local_458[0],local_448[0] + 1);
                    }
                    local_678._0_4_ = local_d28._0_4_;
                    local_670._M_p = (pointer)&local_660;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_670,local_d20._M_p,local_d20._M_p + local_d18._0_8_)
                    ;
                    local_650 = local_d00._0_4_;
                    local_648._M_p = (pointer)&local_638;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_648,local_cf8._M_p,
                               local_cf8._M_p + (long)&local_cf0->offset);
                    local_628._M_p = (pointer)&local_618;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_628,local_cd8._M_p,local_cd0 + (long)local_cd8._M_p)
                    ;
                    local_608 = local_cb8;
                    anon_unknown_49::MakeBinaryRegion
                              ((BinaryRegion *)local_c10,offset,uVar27,type_00,0,0,
                               (BinaryRegionComment *)local_678);
                    std::
                    vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                    emplace_back<flatbuffers::BinaryRegion>(&local_c78,(BinaryRegion *)local_c10);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b98._M_p != local_c88) {
                      operator_delete(local_b98._M_p,local_b88[0]._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_bb8._M_p != &local_ba8) {
                      operator_delete(local_bb8._M_p,local_ba8._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_be8.
                           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                           ._M_impl.super__Vector_impl_data._M_finish != &local_bd0) {
                      operator_delete(local_be8.
                                      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                      ._M_impl.super__Vector_impl_data._M_finish,
                                      local_bd0._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_628._M_p != &local_618) {
                      operator_delete(local_628._M_p,local_618._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_648._M_p != &local_638) {
                      operator_delete(local_648._M_p,local_638._M_allocated_capacity + 1);
                    }
                    uVar25 = local_660._M_allocated_capacity;
                    _Var26._M_p = local_670._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_670._M_p != &local_660) goto LAB_00305ee9;
                    goto LAB_00305ef1;
                  }
                }
                local_6f0._0_4_ = local_d28._0_4_;
                local_6e8._M_p = (pointer)&local_6d8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_6e8,local_d20._M_p,local_d20._M_p + local_d18._0_8_);
                local_6c8 = local_d00._0_4_;
                local_6c0._M_p = (pointer)&local_6b0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_6c0,local_cf8._M_p,
                           local_cf8._M_p + (long)&local_cf0->offset);
                local_6a0._M_p = (pointer)&local_690;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_6a0,local_cd8._M_p,local_cd0 + (long)local_cd8._M_p);
                local_680 = local_cb8;
                anon_unknown_49::MakeBinaryRegion
                          ((BinaryRegion *)local_c10,offset,uVar27,type_00,0,0,
                           (BinaryRegionComment *)local_6f0);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>(&local_c78,(BinaryRegion *)local_c10);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b98._M_p != local_c88) {
                  operator_delete(local_b98._M_p,local_b88[0]._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_bb8._M_p != &local_ba8) {
                  operator_delete(local_bb8._M_p,local_ba8._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_be8.
                       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                       ._M_impl.super__Vector_impl_data._M_finish != &local_bd0) {
                  operator_delete(local_be8.
                                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                                  local_bd0._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6a0._M_p != &local_690) {
                  operator_delete(local_6a0._M_p,local_690._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6c0._M_p != &local_6b0) {
                  operator_delete(local_6c0._M_p,local_6b0._M_allocated_capacity + 1);
                }
                uVar25 = local_6d8._M_allocated_capacity;
                _Var26._M_p = local_6e8._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6e8._M_p != &local_6d8) goto LAB_00305ee9;
                goto LAB_00305ef1;
              }
              if (((uVar3 < 0x1f) || ((ulong)*(ushort *)(field + lVar14 + 0x1e) == 0)) ||
                 (field[*(ushort *)(field + lVar14 + 0x1e)].super_Table == (Table)0x0)) {
                if ((uVar28 < 5) || (uVar28 <= offset + 3)) {
                  local_c90 = 4;
                  local_d34 = UOffset;
                  goto LAB_003045e3;
                }
                local_c90 = 4;
                local_d34 = UOffset;
                uVar27 = (ulong)*(uint *)(this->binary_ + offset);
              }
              else if ((uVar28 < 9) || (uVar28 <= offset + 7)) {
                local_c90 = 8;
                local_d34 = UOffset64;
LAB_003045e3:
                uVar27 = 0;
              }
              else {
                local_c90 = 8;
                local_d34 = UOffset64;
                uVar27 = *(ulong *)(this->binary_ + offset);
              }
              local_d28 = (undefined1  [8])((ulong)local_d28 & 0xffffffff00000000);
              local_d20._M_p = local_d18 + 8;
              local_d18._0_8_ = 0;
              local_d18[8] = '\0';
              local_cf8._M_p = (pointer)&local_ce8;
              local_cf0 = (pointer)0x0;
              local_ce8._M_local_buf[0] = '\0';
              local_cd8._M_p = (pointer)&local_cc8;
              local_cd0 = (char *)0x0;
              local_cc8._M_local_buf[0] = '\0';
              local_cb8 = 0;
              local_d00._0_4_ = TableOffsetField;
              uVar3 = *(ushort *)(field + (4 - (long)*(int *)field));
              uVar4 = *(uint *)(field + uVar3);
              strlen((char *)(field + (ulong)uVar4 + (ulong)uVar3 + 4));
              std::__cxx11::string::_M_replace
                        ((ulong)&local_cf8,0,(char *)0x0,
                         (ulong)(field + (ulong)uVar4 + (ulong)uVar3 + 4));
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_c48,
                         (char *)(field + (ulong)*(uint *)(field + *(ushort *)
                                                                    (field + (4 - (long)*(int *)
                                                  field))) +
                                          (ulong)*(ushort *)(field + (4 - (long)*(int *)field)) + 4)
                         ,(allocator<char> *)&local_a70);
              plVar15 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_c48,0,(char *)0x0,0x37f6c4);
              local_c10._0_8_ = local_c10 + 0x10;
              plVar17 = plVar15 + 2;
              if ((long *)*plVar15 == plVar17) {
                local_c10._16_8_ = *plVar17;
                local_c10._24_8_ = plVar15[3];
              }
              else {
                local_c10._16_8_ = *plVar17;
                local_c10._0_8_ = (long *)*plVar15;
              }
              local_c10._8_8_ = plVar15[1];
              *plVar15 = (long)plVar17;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              plVar15 = (long *)std::__cxx11::string::append(local_c10);
              local_cb0._M_dataplus._M_p = (pointer)&local_cb0.field_2;
              paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(plVar15 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar15 == paVar18) {
                local_cb0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
                local_cb0.field_2._8_8_ = plVar15[3];
              }
              else {
                local_cb0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
                local_cb0._M_dataplus._M_p = (pointer)*plVar15;
              }
              local_cb0._M_string_length = plVar15[1];
              *plVar15 = (long)paVar18;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              if ((undefined1 *)local_c10._0_8_ != local_c10 + 0x10) {
                operator_delete((void *)local_c10._0_8_,(ulong)(local_c10._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c48._M_dataplus._M_p != &local_c48.field_2) {
                operator_delete(local_c48._M_dataplus._M_p,
                                local_c48.field_2._M_allocated_capacity + 1);
              }
              bVar10 = IsInlineField(this,field);
              if (!bVar10) {
                if (uVar27 == 0) {
                  uVar22 = 0;
                  if (offset <= this->binary_length_) {
                    uVar22 = this->binary_length_ - offset;
                  }
                  local_968[0] = local_958;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_968,"4","");
                  local_d28._0_4_ = 0xca;
                  std::__cxx11::string::_M_assign((string *)&local_d20);
                  if (local_968[0] != local_958) {
                    operator_delete(local_968[0],local_958[0] + 1);
                  }
                  local_768._0_4_ = local_d28._0_4_;
                  local_760._M_p = (pointer)&local_750;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_760,local_d20._M_p,local_d20._M_p + local_d18._0_8_);
                  local_740 = local_d00._0_4_;
                  local_738._M_p = (pointer)&local_728;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_738,local_cf8._M_p,
                             local_cf8._M_p + (long)&local_cf0->offset);
                  local_718._M_p = (pointer)&local_708;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_718,local_cd8._M_p,local_cd0 + (long)local_cd8._M_p);
                  local_6f8 = local_cb8;
                  anon_unknown_49::MakeBinaryRegion
                            ((BinaryRegion *)local_c10,offset,uVar22,Unknown,uVar22,0,
                             (BinaryRegionComment *)local_768);
                  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                  ::emplace_back<flatbuffers::BinaryRegion>(&local_c78,(BinaryRegion *)local_c10);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b98._M_p != local_c88) {
                    operator_delete(local_b98._M_p,local_b88[0]._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_bb8._M_p != &local_ba8) {
                    operator_delete(local_bb8._M_p,local_ba8._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_be8.
                         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                         ._M_impl.super__Vector_impl_data._M_finish != &local_bd0) {
                    operator_delete(local_be8.
                                    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,
                                    local_bd0._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_718._M_p != &local_708) {
                    operator_delete(local_718._M_p,local_708._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_738._M_p != &local_728) {
                    operator_delete(local_738._M_p,local_728._M_allocated_capacity + 1);
                  }
                  uVar25 = local_750._M_allocated_capacity;
                  _Var26._M_p = local_760._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_760._M_p != &local_750) {
LAB_003050f5:
                    operator_delete(_Var26._M_p,uVar25 + 1);
                  }
                }
                else {
                  uVar22 = uVar27 + offset;
                  if (uVar22 < this->binary_length_) goto LAB_003047fb;
                  local_478[0] = local_468;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"");
                  local_d28._0_4_ = 0xc9;
                  std::__cxx11::string::_M_assign((string *)&local_d20);
                  if (local_478[0] != local_468) {
                    operator_delete(local_478[0],local_468[0] + 1);
                  }
                  local_7e0._0_4_ = local_d28._0_4_;
                  local_7d8._M_p = (pointer)&local_7c8;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_7d8,local_d20._M_p,local_d20._M_p + local_d18._0_8_);
                  local_7b8 = local_d00._0_4_;
                  local_7b0._M_p = (pointer)&local_7a0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_7b0,local_cf8._M_p,
                             local_cf8._M_p + (long)&local_cf0->offset);
                  local_790._M_p = (pointer)&local_780;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_790,local_cd8._M_p,local_cd0 + (long)local_cd8._M_p);
                  local_770 = local_cb8;
                  anon_unknown_49::MakeBinaryRegion
                            ((BinaryRegion *)local_c10,offset,local_c90,local_d34,0,uVar22,
                             (BinaryRegionComment *)local_7e0);
                  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                  ::emplace_back<flatbuffers::BinaryRegion>(&local_c78,(BinaryRegion *)local_c10);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b98._M_p != local_c88) {
                    operator_delete(local_b98._M_p,local_b88[0]._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_bb8._M_p != &local_ba8) {
                    operator_delete(local_bb8._M_p,local_ba8._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_be8.
                         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                         ._M_impl.super__Vector_impl_data._M_finish != &local_bd0) {
                    operator_delete(local_be8.
                                    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,
                                    local_bd0._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_790._M_p != &local_780) {
                    operator_delete(local_790._M_p,local_780._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_7b0._M_p != &local_7a0) {
                    operator_delete(local_7b0._M_p,local_7a0._M_allocated_capacity + 1);
                  }
                  uVar25 = local_7c8._M_allocated_capacity;
                  _Var26._M_p = local_7d8._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_7d8._M_p != &local_7c8) goto LAB_003050f5;
                }
                goto switchD_0030486a_caseD_11;
              }
              uVar22 = 0;
LAB_003047fb:
              lVar14 = -(long)*(int *)field;
              uVar3 = *(ushort *)(field + -(long)*(int *)field);
              if ((uVar3 < 7) || (uVar27 = (ulong)*(ushort *)(field + lVar14 + 6), uVar27 == 0)) {
                pFVar24 = (Field *)0x0;
              }
              else {
                pFVar24 = field + *(uint *)(field + uVar27) + uVar27;
              }
              if ((*(ushort *)(pFVar24 + -(long)*(int *)pFVar24) < 5) ||
                 ((ulong)*(ushort *)(pFVar24 + (4 - (long)*(int *)pFVar24)) == 0))
              goto switchD_0030486a_caseD_11;
              switch(pFVar24[*(ushort *)(pFVar24 + (4 - (long)*(int *)pFVar24))].super_Table) {
              case (Table)0xd:
                std::__cxx11::string::_M_replace((ulong)&local_cd8,0,local_cd0,0x37f6d6);
                local_858._0_4_ = local_d28._0_4_;
                local_850._M_p = (pointer)&local_840;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_850,local_d20._M_p,local_d20._M_p + local_d18._0_8_);
                local_830 = local_d00._0_4_;
                local_828._M_p = (pointer)&local_818;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_828,local_cf8._M_p,
                           local_cf8._M_p + (long)&local_cf0->offset);
                local_808._M_p = (pointer)&local_7f8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_808,local_cd8._M_p,local_cd0 + (long)local_cd8._M_p);
                local_7e8 = local_cb8;
                anon_unknown_49::MakeBinaryRegion
                          ((BinaryRegion *)local_c10,offset,local_c90,local_d34,0,uVar22,
                           (BinaryRegionComment *)local_858);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>(&local_c78,(BinaryRegion *)local_c10);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b98._M_p != local_c88) {
                  operator_delete(local_b98._M_p,local_b88[0]._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_bb8._M_p != &local_ba8) {
                  operator_delete(local_bb8._M_p,local_ba8._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_be8.
                       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                       ._M_impl.super__Vector_impl_data._M_finish != &local_bd0) {
                  operator_delete(local_be8.
                                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                                  local_bd0._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_808._M_p != &local_7f8) {
                  operator_delete(local_808._M_p,local_7f8._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_828._M_p != &local_818) {
                  operator_delete(local_828._M_p,local_818._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_850._M_p != &local_840) {
                  operator_delete(local_850._M_p,local_840._M_allocated_capacity + 1);
                }
                BuildString(this,uVar22,local_c58,field);
                break;
              case (Table)0xe:
                std::__cxx11::string::_M_replace((ulong)&local_cd8,0,local_cd0,0x37f6df);
                local_8d0._0_4_ = local_d28._0_4_;
                local_8c8._M_p = (pointer)&local_8b8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_8c8,local_d20._M_p,local_d20._M_p + local_d18._0_8_);
                local_8a8 = local_d00._0_4_;
                local_8a0._M_p = (pointer)&local_890;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_8a0,local_cf8._M_p,
                           local_cf8._M_p + (long)&local_cf0->offset);
                local_880._M_p = (pointer)&local_870;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_880,local_cd8._M_p,local_cd0 + (long)local_cd8._M_p);
                local_860 = local_cb8;
                anon_unknown_49::MakeBinaryRegion
                          ((BinaryRegion *)local_c10,offset,local_c90,local_d34,0,uVar22,
                           (BinaryRegionComment *)local_8d0);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>(&local_c78,(BinaryRegion *)local_c10);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b98._M_p != local_c88) {
                  operator_delete(local_b98._M_p,local_b88[0]._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_bb8._M_p != &local_ba8) {
                  operator_delete(local_bb8._M_p,local_ba8._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_be8.
                       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                       ._M_impl.super__Vector_impl_data._M_finish != &local_bd0) {
                  operator_delete(local_be8.
                                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                                  local_bd0._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_880._M_p != &local_870) {
                  operator_delete(local_880._M_p,local_870._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_8a0._M_p != &local_890) {
                  operator_delete(local_8a0._M_p,local_890._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_8c8._M_p != &local_8b8) {
                  operator_delete(local_8c8._M_p,local_8b8._M_allocated_capacity + 1);
                }
                std::
                _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                ::_Rb_tree(&local_1c8,&local_a50->_M_t);
                this_00 = &local_1c8;
                BuildVector(this,uVar22,local_c58,field,local_c80,
                            (map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                             *)this_00);
                goto LAB_00305d3d;
              case (Table)0xf:
                pSVar20 = this->schema_;
                if ((*(ushort *)(pSVar20 + -(long)*(int *)pSVar20) < 5) ||
                   (uVar27 = (ulong)*(ushort *)(pSVar20 + (4 - (long)*(int *)pSVar20)), uVar27 == 0)
                   ) {
                  pSVar20 = (Schema *)0x0;
                }
                else {
                  pSVar20 = pSVar20 + *(uint *)(pSVar20 + uVar27) + uVar27;
                }
                if ((uVar3 < 7) || (uVar27 = (ulong)*(ushort *)(field + lVar14 + 6), uVar27 == 0)) {
                  pFVar24 = (Field *)0x0;
                }
                else {
                  pFVar24 = field + *(uint *)(field + uVar27) + uVar27;
                }
                if (((*(ushort *)(pFVar24 + -(long)*(int *)pFVar24) < 9) ||
                    ((ulong)*(ushort *)(pFVar24 + (8 - (long)*(int *)pFVar24)) == 0)) ||
                   (*(uint *)pSVar20 <=
                    *(uint *)(pFVar24 + *(ushort *)(pFVar24 + (8 - (long)*(int *)pFVar24))))) {
                  __assert_fail("i < size()",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                                ,0xc1,
                                "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Object>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Object>, SizeT = unsigned int]"
                               );
                }
                uVar27 = (ulong)(*(uint *)(pFVar24 +
                                          *(ushort *)(pFVar24 + (8 - (long)*(int *)pFVar24))) << 2);
                lVar6 = *(uint *)(pSVar20 + uVar27 + 4) + uVar27;
                pOVar29 = (Object *)(pSVar20 + lVar6 + 4);
                if (((*(ushort *)(pOVar29 + -(long)*(int *)pOVar29) < 9) ||
                    ((ulong)*(ushort *)(pSVar20 + ((lVar6 + 0xc) - (long)*(int *)pOVar29)) == 0)) ||
                   (pOVar29[*(ushort *)(pSVar20 + ((lVar6 + 0xc) - (long)*(int *)pOVar29))].
                    super_Table == (Table)0x0)) {
                  std::__cxx11::string::operator=((string *)&local_cd8,"(table)");
                  BinaryRegionComment::BinaryRegionComment
                            (&local_a8,(BinaryRegionComment *)local_d28);
                  anon_unknown_49::MakeBinaryRegion
                            ((BinaryRegion *)local_c10,offset,local_c90,local_d34,0,uVar22,&local_a8
                            );
                  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                  ::emplace_back<flatbuffers::BinaryRegion>(&local_c78,(BinaryRegion *)local_c10);
                  BinaryRegion::~BinaryRegion((BinaryRegion *)local_c10);
                  BinaryRegionComment::~BinaryRegionComment(&local_a8);
                  BuildTable(this,uVar22,Table,pOVar29);
                }
                else {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_498,
                             (char *)(field + (ulong)*(uint *)(field + *(ushort *)
                                                                        (field + lVar14 + 4)) +
                                              (ulong)*(ushort *)(field + lVar14 + 4) + 4),
                             (allocator<char> *)local_c10);
                  BuildStruct(this,offset,&local_c78,&local_498,pOVar29);
                  uVar25 = local_498.field_2._M_allocated_capacity;
                  _Var26._M_p = local_498._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_498._M_dataplus._M_p != &local_498.field_2) goto LAB_003050f5;
                }
                break;
              case (Table)0x10:
                uVar19 = 0xffff;
                if ((8 < uVar3) && ((ulong)*(ushort *)(field + lVar14 + 8) != 0)) {
                  uVar19 = *(short *)(field + *(ushort *)(field + lVar14 + 8)) - _S_black;
                }
                p_Var13 = (local_a48->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                ;
                p_Var30 = local_a88;
                if (p_Var13 != (_Base_ptr)0x0) {
                  do {
                    bVar10 = (ushort)(short)p_Var13[1]._M_color < (ushort)uVar19;
                    if (!bVar10) {
                      p_Var30 = p_Var13;
                    }
                    p_Var13 = (&p_Var13->_M_left)[bVar10];
                  } while (p_Var13 != (_Base_ptr)0x0);
                  if ((p_Var30 != local_a88) &&
                     ((ushort)(short)p_Var30[1]._M_color <= (ushort)uVar19)) {
                    std::__cxx11::string::operator=((string *)&local_cd8,"(union)");
                    uVar28 = *(ushort *)&p_Var30[1]._M_left + local_c80;
                    uVar27 = this->binary_length_;
                    if ((uVar27 < 2) || (uVar27 <= uVar28)) {
                      uVar22 = 0;
                      if (uVar28 <= uVar27) {
                        uVar22 = uVar27 - uVar28;
                      }
                      local_988[0] = local_978;
                      std::__cxx11::string::_M_construct<char_const*>((string *)local_988,"1","");
                      local_d28._0_4_ = 0xca;
                      std::__cxx11::string::_M_assign((string *)&local_d20);
                      if (local_988[0] != local_978) {
                        operator_delete(local_988[0],local_978[0] + 1);
                      }
                      BinaryRegionComment::BinaryRegionComment
                                (&local_120,(BinaryRegionComment *)local_d28);
                      anon_unknown_49::MakeBinaryRegion
                                ((BinaryRegion *)local_c10,uVar28,uVar22,Unknown,uVar22,0,&local_120
                                );
                      std::
                      vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                      ::emplace_back<flatbuffers::BinaryRegion>
                                (&local_c78,(BinaryRegion *)local_c10);
                      BinaryRegion::~BinaryRegion((BinaryRegion *)local_c10);
                      BinaryRegionComment::~BinaryRegionComment(&local_120);
                    }
                    else {
                      value = this->binary_[uVar28];
                      bVar10 = IsValidUnionValue(this,field,value);
                      if (bVar10) {
                        BuildUnion_abi_cxx11_(&local_c48,this,uVar22,value,field);
                        std::operator+(&local_a70,"(union of type `",&local_c48);
                        plVar15 = (long *)std::__cxx11::string::append((char *)&local_a70);
                        local_c10._0_8_ = local_c10 + 0x10;
                        plVar17 = plVar15 + 2;
                        if ((long *)*plVar15 == plVar17) {
                          local_c10._16_8_ = *plVar17;
                          local_c10._24_8_ = plVar15[3];
                        }
                        else {
                          local_c10._16_8_ = *plVar17;
                          local_c10._0_8_ = (long *)*plVar15;
                        }
                        local_c10._8_8_ = plVar15[1];
                        *plVar15 = (long)plVar17;
                        plVar15[1] = 0;
                        *(undefined1 *)(plVar15 + 2) = 0;
                        std::__cxx11::string::operator=((string *)&local_cd8,(string *)local_c10);
                        if ((undefined1 *)local_c10._0_8_ != local_c10 + 0x10) {
                          operator_delete((void *)local_c10._0_8_,(ulong)(local_c10._16_8_ + 1));
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
                          operator_delete(local_a70._M_dataplus._M_p,
                                          local_a70.field_2._M_allocated_capacity + 1);
                        }
                        BinaryRegionComment::BinaryRegionComment
                                  (&local_198,(BinaryRegionComment *)local_d28);
                        anon_unknown_49::MakeBinaryRegion
                                  ((BinaryRegion *)local_c10,offset,local_c90,local_d34,0,uVar22,
                                   &local_198);
                        std::
                        vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                        ::emplace_back<flatbuffers::BinaryRegion>
                                  (&local_c78,(BinaryRegion *)local_c10);
                        BinaryRegion::~BinaryRegion((BinaryRegion *)local_c10);
                        BinaryRegionComment::~BinaryRegionComment(&local_198);
                        uVar25 = local_c48.field_2._M_allocated_capacity;
                        _Var26._M_p = local_c48._M_dataplus._M_p;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_c48._M_dataplus._M_p != &local_c48.field_2) goto LAB_003050f5;
                      }
                    }
                  }
                }
                break;
              case (Table)0x12:
                std::__cxx11::string::_M_replace((ulong)&local_cd8,0,local_cd0,0x37f6e8);
                local_948._0_4_ = local_d28._0_4_;
                local_940._M_p = (pointer)&local_930;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_940,local_d20._M_p,local_d20._M_p + local_d18._0_8_);
                local_920 = local_d00._0_4_;
                local_918._M_p = (pointer)&local_908;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_918,local_cf8._M_p,
                           local_cf8._M_p + (long)&local_cf0->offset);
                local_8f8._M_p = (pointer)&local_8e8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_8f8,local_cd8._M_p,local_cd0 + (long)local_cd8._M_p);
                local_8d8 = local_cb8;
                anon_unknown_49::MakeBinaryRegion
                          ((BinaryRegion *)local_c10,offset,local_c90,local_d34,0,uVar22,
                           (BinaryRegionComment *)local_948);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>(&local_c78,(BinaryRegion *)local_c10);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b98._M_p != local_c88) {
                  operator_delete(local_b98._M_p,local_b88[0]._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_bb8._M_p != &local_ba8) {
                  operator_delete(local_bb8._M_p,local_ba8._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_be8.
                       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                       ._M_impl.super__Vector_impl_data._M_finish != &local_bd0) {
                  operator_delete(local_be8.
                                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                                  local_bd0._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_8f8._M_p != &local_8e8) {
                  operator_delete(local_8f8._M_p,local_8e8._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_918._M_p != &local_908) {
                  operator_delete(local_918._M_p,local_908._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_940._M_p != &local_930) {
                  operator_delete(local_940._M_p,local_930._M_allocated_capacity + 1);
                }
                std::
                _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                ::_Rb_tree(&local_1f8,&local_a50->_M_t);
                this_00 = &local_1f8;
                BuildVector(this,uVar22,local_c58,field,local_c80,
                            (map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                             *)this_00);
LAB_00305d3d:
                std::
                _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                ::~_Rb_tree(this_00);
              }
switchD_0030486a_caseD_11:
              uVar25 = local_cb0.field_2._M_allocated_capacity;
              _Var26._M_p = local_cb0._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_cb0._M_dataplus._M_p != &local_cb0.field_2) {
LAB_00305ee9:
                operator_delete(_Var26._M_p,uVar25 + 1);
              }
LAB_00305ef1:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_cd8._M_p != &local_cc8) {
                operator_delete(local_cd8._M_p,
                                CONCAT71(local_cc8._M_allocated_capacity._1_7_,
                                         local_cc8._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_cf8._M_p != &local_ce8) {
                operator_delete(local_cf8._M_p,
                                CONCAT71(local_ce8._M_allocated_capacity._1_7_,
                                         local_ce8._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d20._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_d18 + 8)) {
                uVar25 = CONCAT71(local_d18._9_7_,local_d18[8]);
                _Var26._M_p = local_d20._M_p;
LAB_00306646:
                operator_delete(_Var26._M_p,uVar25 + 1);
              }
LAB_0030664e:
              uVar21 = uVar21 + 1;
              uVar27 = (long)iStack_c20._M_current - (long)local_c28._M_current >> 4;
            } while (uVar21 < uVar27);
          }
        }
        uVar22 = local_c78.
                 super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].offset;
        uVar5 = local_c78.
                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].length;
        uVar27 = uVar5 + uVar22 + 1;
        bVar10 = uVar27 <= local_a80;
        local_a80 = local_a80 - uVar27;
        if (bVar10 && local_a80 != 0) {
          paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_d18 + 8);
          local_d28 = (undefined1  [8])((ulong)local_d28 & 0xffffffff00000000);
          local_d18._0_8_ = 0;
          local_d18[8] = '\0';
          local_cf0 = (pointer)0x0;
          local_ce8._M_local_buf[0] = '\0';
          local_cd0 = (char *)0x0;
          local_cc8._M_local_buf[0] = '\0';
          local_cb8 = 0;
          local_d00._0_4_ = Padding;
          local_3f8._0_4_ = OK;
          local_3f0._M_p = (pointer)&local_3e0;
          local_d20._M_p = (pointer)paVar18;
          local_cf8._M_p = (pointer)&local_ce8;
          local_cd8._M_p = (pointer)&local_cc8;
          std::__cxx11::string::_M_construct<char*>((string *)&local_3f0,paVar18,paVar18);
          local_3d0 = local_d00._0_4_;
          local_3c8._M_p = (pointer)&local_3b8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3c8,local_cf8._M_p,local_cf8._M_p + (long)&local_cf0->offset);
          local_3a8._M_p = (pointer)&local_398;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3a8,local_cd8._M_p,local_cd0 + (long)local_cd8._M_p);
          local_388 = local_cb8;
          anon_unknown_49::MakeBinaryRegion
                    ((BinaryRegion *)local_c10,uVar5 + uVar22,local_a80 + 1,Uint8,local_a80 + 1,0,
                     (BinaryRegionComment *)local_3f8);
          std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
          emplace_back<flatbuffers::BinaryRegion>(&local_c78,(BinaryRegion *)local_c10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b98._M_p != local_b88) {
            operator_delete(local_b98._M_p,local_b88[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_bb8._M_p != &local_ba8) {
            operator_delete(local_bb8._M_p,local_ba8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_be8.
                 super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                 ._M_impl.super__Vector_impl_data._M_finish != &local_bd0) {
            operator_delete(local_be8.
                            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                            local_bd0._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_p != &local_398) {
            operator_delete(local_3a8._M_p,local_398._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_p != &local_3b8) {
            operator_delete(local_3c8._M_p,local_3b8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f0._M_p != &local_3e0) {
            operator_delete(local_3f0._M_p,local_3e0._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_cd8._M_p != &local_cc8) {
            operator_delete(local_cd8._M_p,
                            CONCAT71(local_cc8._M_allocated_capacity._1_7_,local_cc8._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_cf8._M_p != &local_ce8) {
            operator_delete(local_cf8._M_p,
                            CONCAT71(local_ce8._M_allocated_capacity._1_7_,local_ce8._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d20._M_p != paVar18) {
            operator_delete(local_d20._M_p,CONCAT71(local_d18._9_7_,local_d18[8]) + 1);
          }
        }
        pOVar29 = local_c58 + *(ushort *)(local_c58 + (4 - (long)*(int *)local_c58));
        local_d28 = (undefined1  [8])local_d18;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d28,
                   pOVar29 + (ulong)*(uint *)(local_c58 +
                                             *(ushort *)(local_c58 + (4 - (long)*(int *)local_c58)))
                             + 4,
                   pOVar29 + (ulong)*(uint *)(pOVar29 + (ulong)*(uint *)(local_c58 +
                                                                        *(ushort *)
                                                                         (local_c58 +
                                                                         (4 - (long)*(int *)
                                                  local_c58))) + 4 + -4) +
                             (ulong)*(uint *)(local_c58 +
                                             *(ushort *)(local_c58 + (4 - (long)*(int *)local_c58)))
                             + 4);
        local_218.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_c78.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_218.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_c78.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_218.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_c78.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_c78.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_c78.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c78.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        anon_unknown_49::MakeBinarySection
                  ((BinarySection *)local_c10,(string *)local_d28,local_a74,&local_218);
        AddSection(this,local_c80,(BinarySection *)local_c10);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                  (&local_be8);
        if ((undefined1 *)local_c10._0_8_ != local_c10 + 0x10) {
          operator_delete((void *)local_c10._0_8_,(ulong)(local_c10._16_8_ + 1));
        }
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                  (&local_218);
        if (local_d28 != (undefined1  [8])local_d18) {
          operator_delete((void *)local_d28,local_d18._0_8_ + 1);
        }
        if (local_c28._M_current != (Entry *)0x0) {
          operator_delete(local_c28._M_current,(long)local_c18 - (long)local_c28._M_current);
        }
      }
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                (&local_c78);
      goto LAB_00306be0;
    }
    local_438[0] = local_428;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"");
    local_a40 = ERROR_OFFSET_OUT_OF_BINARY;
    std::__cxx11::string::_M_assign((string *)&local_a38);
    pOVar29 = local_c58;
    if (local_438[0] != local_428) {
      operator_delete(local_438[0],local_428[0] + 1);
    }
    pOVar1 = pOVar29 + *(ushort *)(pOVar29 + (4 - (long)*(int *)pOVar29));
    local_cb0._M_dataplus._M_p = (pointer)&local_cb0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_cb0,
               pOVar1 + (ulong)*(uint *)(pOVar29 +
                                        *(ushort *)(pOVar29 + (4 - (long)*(int *)pOVar29))) + 4,
               pOVar1 + (ulong)*(uint *)(pOVar1 + (ulong)*(uint *)(pOVar29 +
                                                                  *(ushort *)
                                                                   (pOVar29 +
                                                                   (4 - (long)*(int *)pOVar29))) + 4
                                        + -4) +
                        (ulong)*(uint *)(pOVar29 +
                                        *(ushort *)(pOVar29 + (4 - (long)*(int *)pOVar29))) + 4);
    local_380._0_4_ = local_a40;
    local_378._M_p = (pointer)&local_368;
    std::__cxx11::string::_M_construct<char*>((string *)&local_378,local_a38,local_a38 + local_a30);
    local_358 = local_a18;
    local_350._M_p = (pointer)&local_340;
    std::__cxx11::string::_M_construct<char*>((string *)&local_350,local_a10,local_a10 + local_a08);
    local_330._M_p = (pointer)&local_320;
    std::__cxx11::string::_M_construct<char*>((string *)&local_330,local_9f0,local_9f0 + local_9e8);
    local_310 = local_9d0;
    anon_unknown_49::MakeBinaryRegion
              ((BinaryRegion *)local_c10,table_offset,4,SOffset,0,uVar21,
               (BinaryRegionComment *)local_380);
    anon_unknown_49::MakeSingleRegionBinarySection
              ((BinarySection *)local_d28,&local_cb0,type,(BinaryRegion *)local_c10);
    AddSection(this,table_offset,(BinarySection *)local_d28);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
              ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
               local_d00);
    if (local_d28 != (undefined1  [8])local_d18) {
      operator_delete((void *)local_d28,local_d18._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b98._M_p != local_b88) {
      operator_delete(local_b98._M_p,local_b88[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bb8._M_p != &local_ba8) {
      operator_delete(local_bb8._M_p,local_ba8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_be8.
           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
           ._M_impl.super__Vector_impl_data._M_finish != &local_bd0) {
      operator_delete(local_be8.
                      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                      ._M_impl.super__Vector_impl_data._M_finish,local_bd0._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_p != &local_320) {
      operator_delete(local_330._M_p,local_320._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_p != &local_340) {
      operator_delete(local_350._M_p,local_340._M_allocated_capacity + 1);
    }
    local_2f0._M_allocated_capacity = local_368._M_allocated_capacity;
    _Var26._M_p = local_378._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_p != &local_368) goto LAB_003041bb;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cb0._M_dataplus._M_p != &local_cb0.field_2) {
    operator_delete(local_cb0._M_dataplus._M_p,local_cb0.field_2._M_allocated_capacity + 1);
  }
LAB_00306be0:
  if (local_9f0 != &local_9e0) {
    operator_delete(local_9f0,CONCAT71(uStack_9df,local_9e0) + 1);
  }
  if (local_a10 != &local_a00) {
    operator_delete(local_a10,CONCAT71(uStack_9ff,local_a00) + 1);
  }
  if (local_a38 != &local_a28) {
    operator_delete(local_a38,CONCAT71(uStack_a27,local_a28) + 1);
  }
  return;
}

Assistant:

void BinaryAnnotator::BuildTable(const uint64_t table_offset,
                                 const BinarySectionType type,
                                 const reflection::Object *const table) {
  if (ContainsSection(table_offset)) { return; }

  BinaryRegionComment vtable_offset_comment;
  vtable_offset_comment.type = BinaryRegionCommentType::TableVTableOffset;

  const auto vtable_soffset = ReadScalar<int32_t>(table_offset);

  if (!vtable_soffset.has_value()) {
    const uint64_t remaining = RemainingBytes(table_offset);
    SetError(vtable_offset_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
             "4");

    AddSection(
        table_offset,
        MakeSingleRegionBinarySection(
            table->name()->str(), type,
            MakeBinaryRegion(table_offset, remaining, BinaryRegionType::Unknown,
                             remaining, 0, vtable_offset_comment)));

    // If there aren't enough bytes left to read the vtable offset, there is
    // nothing we can do.
    return;
  }

  // Tables start with the vtable
  const uint64_t vtable_offset = table_offset - vtable_soffset.value();

  if (!IsValidOffset(vtable_offset)) {
    SetError(vtable_offset_comment,
             BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);

    AddSection(table_offset,
               MakeSingleRegionBinarySection(
                   table->name()->str(), type,
                   MakeBinaryRegion(table_offset, sizeof(int32_t),
                                    BinaryRegionType::SOffset, 0, vtable_offset,
                                    vtable_offset_comment)));

    // There isn't much to do with an invalid vtable offset, as we won't be able
    // to intepret the rest of the table fields.
    return;
  }

  std::vector<BinaryRegion> regions;
  regions.push_back(MakeBinaryRegion(table_offset, sizeof(int32_t),
                                     BinaryRegionType::SOffset, 0,
                                     vtable_offset, vtable_offset_comment));

  // Parse the vtable first so we know what the rest of the fields in the table
  // are.
  const VTable *const vtable =
      GetOrBuildVTable(vtable_offset, table, table_offset);

  if (vtable == nullptr) {
    // There is no valid vtable for this table, so we cannot process the rest of
    // the table entries.
    return;
  }

  // This is the size and length of this table.
  const uint16_t table_size = vtable->table_size;
  uint64_t table_end_offset = table_offset + table_size;

  if (!IsValidOffset(table_end_offset - 1)) {
    // We already validated the table size in BuildVTable, but we have to make
    // sure we don't use a bad value here.
    table_end_offset = binary_length_;
  }

  // We need to iterate over the vtable fields by their offset in the binary,
  // not by their IDs. So copy them over to another vector that we can sort on
  // the offset_from_table property.
  std::vector<VTable::Entry> fields;
  for (const auto &vtable_field : vtable->fields) {
    fields.push_back(vtable_field.second);
  }

  std::stable_sort(fields.begin(), fields.end(),
                   [](const VTable::Entry &a, const VTable::Entry &b) {
                     return a.offset_from_table < b.offset_from_table;
                   });

  // Iterate over all the fields by order of their offset.
  for (size_t i = 0; i < fields.size(); ++i) {
    const reflection::Field *field = fields[i].field;
    const uint16_t offset_from_table = fields[i].offset_from_table;

    if (offset_from_table == 0) {
      // Skip non-present fields.
      continue;
    }

    // The field offsets are relative to the start of the table.
    const uint64_t field_offset = table_offset + offset_from_table;

    if (!IsValidOffset(field_offset)) {
      // The field offset is larger than the binary, nothing we can do.
      continue;
    }

    // We have a vtable entry for a non-existant field, that means its a binary
    // generated by a newer schema than we are currently processing.
    if (field == nullptr) {
      // Calculate the length of this unknown field.
      const uint64_t unknown_field_length =
          // Check if there is another unknown field after this one.
          ((i + 1 < fields.size())
               ? table_offset + fields[i + 1].offset_from_table
               // Otherwise use the known end of the table.
               : table_end_offset) -
          field_offset;

      if (unknown_field_length == 0) { continue; }

      std::string hint;

      if (unknown_field_length == 4) {
        const auto relative_offset = ReadScalar<uint32_t>(field_offset);
        if (relative_offset.has_value()) {
          // The field is 4 in length, so it could be an offset? Provide a hint.
          hint += "<possibly an offset? Check Loc: +0x";
          hint += ToHex(field_offset + relative_offset.value());
          hint += ">";
        }
      }

      BinaryRegionComment unknown_field_comment;
      unknown_field_comment.type = BinaryRegionCommentType::TableUnknownField;

      if (!IsValidRead(field_offset, unknown_field_length)) {
        const uint64_t remaining = RemainingBytes(field_offset);

        SetError(unknown_field_comment,
                 BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
                 std::to_string(unknown_field_length));

        regions.push_back(MakeBinaryRegion(field_offset, remaining,
                                           BinaryRegionType::Unknown, remaining,
                                           0, unknown_field_comment));
        continue;
      }

      unknown_field_comment.default_value = hint;

      regions.push_back(MakeBinaryRegion(
          field_offset, unknown_field_length, BinaryRegionType::Unknown,
          unknown_field_length, 0, unknown_field_comment));
      continue;
    }

    if (IsScalar(field->type()->base_type())) {
      // These are the raw values store in the table.
      const uint64_t type_size = GetTypeSize(field->type()->base_type());
      const BinaryRegionType region_type =
          GetRegionType(field->type()->base_type());

      BinaryRegionComment scalar_field_comment;
      scalar_field_comment.type = BinaryRegionCommentType::TableField;
      scalar_field_comment.name =
          std::string(field->name()->c_str()) + "` (" +
          reflection::EnumNameBaseType(field->type()->base_type()) + ")";

      if (!IsValidRead(field_offset, type_size)) {
        const uint64_t remaining = RemainingBytes(field_offset);
        SetError(scalar_field_comment,
                 BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
                 std::to_string(type_size));

        regions.push_back(MakeBinaryRegion(field_offset, remaining,
                                           BinaryRegionType::Unknown, remaining,
                                           0, scalar_field_comment));
        continue;
      }

      if (IsUnionType(field)) {
        // This is a type for a union. Validate the value
        const auto enum_value = ReadScalar<uint8_t>(field_offset);

        // This should always have a value, due to the IsValidRead check above.
        if (!IsValidUnionValue(field, enum_value.value())) {
          SetError(scalar_field_comment,
                   BinaryRegionStatus::ERROR_INVALID_UNION_TYPE);

          regions.push_back(MakeBinaryRegion(field_offset, type_size,
                                             region_type, 0, 0,
                                             scalar_field_comment));
          continue;
        }
      }

      regions.push_back(MakeBinaryRegion(field_offset, type_size, region_type,
                                         0, 0, scalar_field_comment));
      continue;
    }

    // Read the offset
    uint64_t offset = 0;
    uint64_t length = sizeof(uint32_t);
    BinaryRegionType region_type = BinaryRegionType::UOffset;

    if (field->offset64()) {
      length = sizeof(uint64_t);
      region_type = BinaryRegionType::UOffset64;
      offset = ReadScalar<uint64_t>(field_offset).value_or(0);
    } else {
      offset = ReadScalar<uint32_t>(field_offset).value_or(0);
    }
    // const auto offset_from_field = ReadScalar<uint32_t>(field_offset);
    uint64_t offset_of_next_item = 0;
    BinaryRegionComment offset_field_comment;
    offset_field_comment.type = BinaryRegionCommentType::TableOffsetField;
    offset_field_comment.name = field->name()->c_str();
    const std::string offset_prefix =
        "offset to field `" + std::string(field->name()->c_str()) + "`";

    // Validate any field that isn't inline (i.e., non-structs).
    if (!IsInlineField(field)) {
      if (offset == 0) {
        const uint64_t remaining = RemainingBytes(field_offset);

        SetError(offset_field_comment,
                 BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "4");

        regions.push_back(MakeBinaryRegion(field_offset, remaining,
                                           BinaryRegionType::Unknown, remaining,
                                           0, offset_field_comment));
        continue;
      }

      offset_of_next_item = field_offset + offset;

      if (!IsValidOffset(offset_of_next_item)) {
        SetError(offset_field_comment,
                 BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);
        regions.push_back(MakeBinaryRegion(field_offset, length, region_type, 0,
                                           offset_of_next_item,
                                           offset_field_comment));
        continue;
      }
    }

    switch (field->type()->base_type()) {
      case reflection::BaseType::Obj: {
        const reflection::Object *next_object =
            schema_->objects()->Get(field->type()->index());

        if (next_object->is_struct()) {
          // Structs are stored inline.
          BuildStruct(field_offset, regions, field->name()->c_str(),
                      next_object);
        } else {
          offset_field_comment.default_value = "(table)";

          regions.push_back(MakeBinaryRegion(field_offset, length, region_type,
                                             0, offset_of_next_item,
                                             offset_field_comment));

          BuildTable(offset_of_next_item, BinarySectionType::Table,
                     next_object);
        }
      } break;

      case reflection::BaseType::String: {
        offset_field_comment.default_value = "(string)";
        regions.push_back(MakeBinaryRegion(field_offset, length, region_type, 0,
                                           offset_of_next_item,
                                           offset_field_comment));
        BuildString(offset_of_next_item, table, field);
      } break;

      case reflection::BaseType::Vector: {
        offset_field_comment.default_value = "(vector)";
        regions.push_back(MakeBinaryRegion(field_offset, length, region_type, 0,
                                           offset_of_next_item,
                                           offset_field_comment));
        BuildVector(offset_of_next_item, table, field, table_offset,
                    vtable->fields);
      } break;
      case reflection::BaseType::Vector64: {
        offset_field_comment.default_value = "(vector64)";
        regions.push_back(MakeBinaryRegion(field_offset, length, region_type, 0,
                                           offset_of_next_item,
                                           offset_field_comment));
        BuildVector(offset_of_next_item, table, field, table_offset,
                    vtable->fields);
      } break;

      case reflection::BaseType::Union: {
        const uint64_t union_offset = offset_of_next_item;

        // The union type field is always one less than the union itself.
        const uint16_t union_type_id = field->id() - 1;

        auto vtable_field = vtable->fields.find(union_type_id);
        if (vtable_field == vtable->fields.end()) {
          // TODO(dbaileychess): need to capture this error condition.
          break;
        }
        offset_field_comment.default_value = "(union)";

        const uint64_t type_offset =
            table_offset + vtable_field->second.offset_from_table;

        const auto realized_type = ReadScalar<uint8_t>(type_offset);
        if (!realized_type.has_value()) {
          const uint64_t remaining = RemainingBytes(type_offset);
          SetError(offset_field_comment,
                   BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "1");
          regions.push_back(MakeBinaryRegion(
              type_offset, remaining, BinaryRegionType::Unknown, remaining, 0,
              offset_field_comment));
          continue;
        }

        if (!IsValidUnionValue(field, realized_type.value())) {
          // We already export an error in the union type field, so just skip
          // building the union itself and it will default to an unreference
          // Binary section.
          continue;
        }

        const std::string enum_type =
            BuildUnion(union_offset, realized_type.value(), field);

        offset_field_comment.default_value =
            "(union of type `" + enum_type + "`)";

        regions.push_back(MakeBinaryRegion(field_offset, length, region_type, 0,
                                           union_offset, offset_field_comment));

      } break;

      default: break;
    }
  }

  // Handle the case where there is padding after the last known binary
  // region. Calculate where we left off towards the expected end of the
  // table.
  const uint64_t i = regions.back().offset + regions.back().length + 1;

  if (i < table_end_offset) {
    const uint64_t pad_bytes = table_end_offset - i + 1;

    BinaryRegionComment padding_comment;
    padding_comment.type = BinaryRegionCommentType::Padding;

    regions.push_back(MakeBinaryRegion(i - 1, pad_bytes * sizeof(uint8_t),
                                       BinaryRegionType::Uint8, pad_bytes, 0,
                                       padding_comment));
  }

  AddSection(table_offset,
             MakeBinarySection(table->name()->str(), type, std::move(regions)));
}